

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rolemaskproxymodel.cpp
# Opt level: O3

void RoleMaskProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<int> *this;
  QList<int> *newRoles;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  __atomic_base<int> _Var5;
  RoleMaskProxyModel *_t;
  undefined8 *puVar6;
  int iVar7;
  undefined1 local_39;
  QArrayDataPointer<int> local_38;
  void *local_20;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_39 = *_a[1];
      local_38.ptr = (int *)&local_39;
      iVar7 = 0;
      break;
    case 1:
      local_39 = *_a[1];
      local_38.ptr = (int *)&local_39;
      iVar7 = 1;
      break;
    case 2:
      local_39 = *_a[1];
      local_38.ptr = (int *)&local_39;
      iVar7 = 2;
      break;
    case 3:
      QMetaObject::activate(_o,&staticMetaObject,3,(void **)0x0);
      return;
    case 4:
      local_20 = _a[3];
      local_38.ptr = (int *)_a[1];
      local_38.size = (qsizetype)_a[2];
      iVar7 = 4;
      break;
    default:
      goto switchD_0011cd34_caseD_4;
    }
    local_38.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_38.d);
    break;
  case ReadProperty:
    if ((uint)_id < 4) {
      this = (QArrayDataPointer<int> *)*_a;
      switch(_id) {
      case 0:
        bVar4 = transparentIfEmpty((RoleMaskProxyModel *)_o);
        break;
      case 1:
        bVar4 = mergeDisplayEdit((RoleMaskProxyModel *)_o);
        break;
      case 2:
        bVar4 = maskHeaderData((RoleMaskProxyModel *)_o);
        break;
      case 3:
        maskedRoles((QList<int> *)&local_38,(RoleMaskProxyModel *)_o);
        QArrayDataPointer<int>::operator=(this,&local_38);
        if (&(local_38.d)->super_QArrayData == (QArrayData *)0x0) {
          return;
        }
        LOCK();
        ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) {
          return;
        }
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,4,8);
        return;
      }
      *(bool *)&this->d = bVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      newRoles = (QList<int> *)*_a;
      switch(_id) {
      case 0:
        setTransparentIfEmpty((RoleMaskProxyModel *)_o,*(bool *)&(newRoles->d).d);
        return;
      case 1:
        setMergeDisplayEdit((RoleMaskProxyModel *)_o,*(bool *)&(newRoles->d).d);
        return;
      case 2:
        setMaskHeaderData((RoleMaskProxyModel *)_o,*(bool *)&(newRoles->d).d);
        return;
      case 3:
        setMaskedRoles((RoleMaskProxyModel *)_o,newRoles);
        return;
      }
    }
    break;
  case ResetProperty:
    if (_id == 3) {
      clearMaskedRoles((RoleMaskProxyModel *)_o);
      return;
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == mergeDisplayEditChanged && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == transparentIfEmptyChanged && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == maskHeaderDataChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == maskedRolesChanged && lVar3 == 0) {
      *puVar1 = 3;
    }
    else if (pcVar2 == maskedDataChanged && lVar3 == 0) {
      *puVar1 = 4;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 3) {
      local_38.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
      _Var5._M_i = (__int_type)
                   QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType.typeId._q_value.
                   super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        _Var5._M_i = QMetaType::idHelper();
      }
      ((__atomic_base<int> *)*_a)->_M_i = _Var5._M_i;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 4) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 2) {
        *puVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        return;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
  }
switchD_0011cd34_caseD_4:
  return;
}

Assistant:

void RoleMaskProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->mergeDisplayEditChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->transparentIfEmptyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->maskHeaderDataChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->maskedRolesChanged(); break;
        case 4: _t->maskedDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::mergeDisplayEditChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::transparentIfEmptyChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskHeaderDataChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskedRolesChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(const QModelIndex & , const QModelIndex & , const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskedDataChanged)) {
                *result = 4;
                return;
            }
        }
    } else if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QList<int> >(); break;
        }
    }

#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->transparentIfEmpty(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->mergeDisplayEdit(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->maskHeaderData(); break;
        case 3: *reinterpret_cast< QList<int>*>(_v) = _t->maskedRoles(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTransparentIfEmpty(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setMergeDisplayEdit(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setMaskHeaderData(*reinterpret_cast< bool*>(_v)); break;
        case 3: _t->setMaskedRoles(*reinterpret_cast< QList<int>*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 3: _t->clearMaskedRoles(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}